

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KEncodersDecoders.h
# Opt level: O2

void __thiscall KDIS::NetToDataType<float>::SwapBytes(NetToDataType<float> *this)

{
  KUINT16 i;
  long lVar1;
  ulong uVar2;
  KUINT16 i_1;
  KOCTET Temp [4];
  
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    Temp[lVar1] = *(KOCTET *)((long)this + lVar1);
  }
  uVar2 = 3;
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    *(KOCTET *)((long)this + lVar1) = Temp[uVar2 & 0xffff];
    uVar2 = (ulong)((int)uVar2 - 1);
  }
  return;
}

Assistant:

void SwapBytes()
    {
        KOCTET Temp[sizeof( DataType )];

        // Copy Data To temp;
        for( KUINT16 i = 0; i < sizeof( DataType ); ++i )
        {
            Temp[i] = m_Octs[i];
        }

        // Now swap bytes
        KUINT16 j = ( sizeof( DataType ) ) - 1 ;

        for( KUINT16 i = 0; i < sizeof( DataType ); ++i )
        {
            m_Octs[i] = Temp[j];
            --j;
        }
    }